

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_clump.c
# Opt level: O2

REF_STATUS ref_clump_tri_around(REF_GRID_conflict ref_grid,REF_INT node,char *filename)

{
  REF_CELL ref_cell;
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  FILE *__s;
  long lVar5;
  undefined8 uVar6;
  REF_GRID_conflict pRVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  REF_INT RVar11;
  long lVar12;
  REF_INT local;
  REF_DICT node_dict;
  REF_DICT tri_dict;
  REF_GRID_conflict local_170;
  REF_INT local_164;
  char *local_160;
  REF_DBL xyz_phys [3];
  REF_DBL xyz_comp [3];
  REF_INT nodes [27];
  REF_DBL m [6];
  REF_DBL jacob [9];
  
  ref_cell = ref_grid->cell[3];
  uVar4 = ref_dict_create(&node_dict);
  if (uVar4 == 0) {
    uVar4 = ref_dict_create(&tri_dict);
    if (uVar4 == 0) {
      uVar9 = 0xffffffff;
      RVar11 = -1;
      if (-1 < node) {
        pRVar1 = ref_cell->ref_adj;
        uVar9 = 0xffffffff;
        RVar11 = -1;
        if (node < pRVar1->nnode) {
          uVar4 = pRVar1->first[(uint)node];
          uVar9 = 0xffffffff;
          RVar11 = -1;
          if ((long)(int)uVar4 != -1) {
            RVar11 = pRVar1->item[(int)uVar4].ref;
            uVar9 = (ulong)uVar4;
          }
        }
      }
      local_170 = ref_grid;
      local_164 = node;
      local_160 = filename;
      while (pcVar8 = local_160, pRVar7 = local_170, (int)uVar9 != -1) {
        uVar4 = ref_cell_nodes(ref_cell,RVar11,nodes);
        if (uVar4 != 0) {
          uVar9 = (ulong)uVar4;
          pcVar8 = "n";
          uVar6 = 0x184;
          goto LAB_001c4a1c;
        }
        uVar4 = ref_dict_store(tri_dict,RVar11,0);
        if (uVar4 != 0) {
          uVar9 = (ulong)uVar4;
          pcVar8 = "store";
          uVar6 = 0x185;
          goto LAB_001c4a1c;
        }
        lVar12 = 0;
        while (lVar12 < ref_cell->node_per) {
          uVar4 = ref_dict_store(node_dict,nodes[lVar12],0);
          lVar12 = lVar12 + 1;
          if (uVar4 != 0) {
            uVar9 = (ulong)uVar4;
            pcVar8 = "store";
            uVar6 = 0x187;
            goto LAB_001c4a1c;
          }
        }
        pRVar2 = ref_cell->ref_adj->item;
        uVar9 = (ulong)pRVar2[(int)uVar9].next;
        RVar11 = -1;
        if (uVar9 != 0xffffffffffffffff) {
          RVar11 = pRVar2[uVar9].ref;
        }
      }
      __s = fopen(local_160,"w");
      if (__s == (FILE *)0x0) {
        printf("unable to open %s\n",pcVar8);
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",
               0x18c,"ref_clump_tri_around","unable to open file");
        return 2;
      }
      fwrite("title=\"tecplot refine clump file\"\n",0x22,1,__s);
      fwrite("variables = \"x\" \"y\" \"z\"\n",0x18,1,__s);
      fprintf(__s,"zone t=\"clump\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
              (ulong)(uint)node_dict->n,(ulong)(uint)tri_dict->n,"point","fequadrilateral");
      RVar11 = local_164;
      uVar4 = ref_node_metric_get(pRVar7->node,local_164,m);
      if (uVar4 == 0) {
        uVar4 = ref_matrix_jacob_m(m,jacob);
        if (uVar4 == 0) {
          lVar10 = (long)(RVar11 * 0xf);
          for (lVar12 = 0; lVar12 < node_dict->n; lVar12 = lVar12 + 1) {
            local = node_dict->key[lVar12];
            lVar5 = (long)local;
            pRVar3 = pRVar7->node->real;
            xyz_phys[0] = pRVar3[lVar5 * 0xf] - pRVar3[lVar10];
            xyz_phys[1] = pRVar3[lVar5 * 0xf + 1] - pRVar3[lVar10 + 1];
            xyz_phys[2] = pRVar3[lVar5 * 0xf + 2] - pRVar3[lVar10 + 2];
            uVar4 = ref_matrix_vect_mult(jacob,xyz_phys,xyz_comp);
            if (uVar4 != 0) {
              uVar9 = (ulong)uVar4;
              pcVar8 = "ax";
              uVar6 = 0x1a0;
              goto LAB_001c4a1c;
            }
            fprintf(__s," %.16e %.16e %.16e\n",xyz_comp[0],xyz_comp[1],xyz_comp[2]);
          }
          pRVar7 = (REF_GRID_conflict)0x0;
          while ((long)pRVar7 < (long)tri_dict->n) {
            local_170 = pRVar7;
            uVar4 = ref_cell_nodes(ref_cell,tri_dict->key[(long)pRVar7],nodes);
            if (uVar4 != 0) {
              uVar9 = (ulong)uVar4;
              pcVar8 = "n";
              uVar6 = 0x1a6;
              goto LAB_001c4a1c;
            }
            for (lVar12 = 0; lVar12 < ref_cell->node_per; lVar12 = lVar12 + 1) {
              uVar4 = ref_dict_location(node_dict,nodes[lVar12],&local);
              if (uVar4 != 0) {
                uVar9 = (ulong)uVar4;
                pcVar8 = "ret";
                uVar6 = 0x1a8;
                goto LAB_001c4a1c;
              }
              fprintf(__s," %d",(ulong)(local + 1));
            }
            uVar4 = ref_dict_location(node_dict,nodes[0],&local);
            if (uVar4 != 0) {
              uVar9 = (ulong)uVar4;
              pcVar8 = "ret";
              uVar6 = 0x1ab;
              goto LAB_001c4a1c;
            }
            fprintf(__s," %d",(ulong)(local + 1));
            fputc(10,__s);
            pRVar7 = (REF_GRID_conflict)((long)&local_170->mpi + 1);
          }
          fclose(__s);
          uVar4 = ref_dict_free(tri_dict);
          if (uVar4 == 0) {
            uVar4 = ref_dict_free(node_dict);
            if (uVar4 == 0) {
              return 0;
            }
            uVar9 = (ulong)uVar4;
            pcVar8 = "free nodes";
            uVar6 = 0x1b3;
          }
          else {
            uVar9 = (ulong)uVar4;
            pcVar8 = "free tris";
            uVar6 = 0x1b2;
          }
        }
        else {
          uVar9 = (ulong)uVar4;
          pcVar8 = "jac";
          uVar6 = 0x197;
        }
      }
      else {
        uVar9 = (ulong)uVar4;
        pcVar8 = "get";
        uVar6 = 0x196;
      }
    }
    else {
      uVar9 = (ulong)uVar4;
      pcVar8 = "create tris";
      uVar6 = 0x181;
    }
  }
  else {
    uVar9 = (ulong)uVar4;
    pcVar8 = "create nodes";
    uVar6 = 0x180;
  }
LAB_001c4a1c:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_clump.c",uVar6,
         "ref_clump_tri_around",uVar9,pcVar8);
  return (REF_STATUS)uVar9;
}

Assistant:

REF_FCN REF_STATUS ref_clump_tri_around(REF_GRID ref_grid, REF_INT node,
                                        const char *filename) {
  REF_DICT node_dict, tri_dict;
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell, cell_node;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT local;
  REF_DBL xyz_comp[3], xyz_phys[3];
  REF_DBL m[6], jacob[9];

  FILE *f;

  RSS(ref_dict_create(&node_dict), "create nodes");
  RSS(ref_dict_create(&tri_dict), "create tris");

  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    RSS(ref_dict_store(tri_dict, cell, 0), "store");
    each_ref_cell_cell_node(ref_cell, cell_node)
        RSS(ref_dict_store(node_dict, nodes[cell_node], 0), "store");
  }

  f = fopen(filename, "w");
  if (NULL == (void *)f) printf("unable to open %s\n", filename);
  RNS(f, "unable to open file");

  fprintf(f, "title=\"tecplot refine clump file\"\n");
  fprintf(f, "variables = \"x\" \"y\" \"z\"\n");

  fprintf(
      f,
      "zone t=\"clump\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
      ref_dict_n(node_dict), ref_dict_n(tri_dict), "point", "fequadrilateral");

  RSS(ref_node_metric_get(ref_grid_node(ref_grid), node, m), "get");
  RSS(ref_matrix_jacob_m(m, jacob), "jac");
  for (item = 0; item < ref_dict_n(node_dict); item++) {
    local = ref_dict_key(node_dict, item);
    xyz_phys[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, local) -
                  ref_node_xyz(ref_grid_node(ref_grid), 0, node);
    xyz_phys[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, local) -
                  ref_node_xyz(ref_grid_node(ref_grid), 1, node);
    xyz_phys[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, local) -
                  ref_node_xyz(ref_grid_node(ref_grid), 2, node);
    RSS(ref_matrix_vect_mult(jacob, xyz_phys, xyz_comp), "ax");
    fprintf(f, " %.16e %.16e %.16e\n", xyz_comp[0], xyz_comp[1], xyz_comp[2]);
  }

  for (item = 0; item < ref_dict_n(tri_dict); item++) {
    cell = ref_dict_key(tri_dict, item);
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "n");
    each_ref_cell_cell_node(ref_cell, cell_node) {
      RSS(ref_dict_location(node_dict, nodes[cell_node], &local), "ret");
      fprintf(f, " %d", local + 1);
    }
    RSS(ref_dict_location(node_dict, nodes[0], &local), "ret");
    fprintf(f, " %d", local + 1);
    fprintf(f, "\n");
  }

  fclose(f);

  RSS(ref_dict_free(tri_dict), "free tris");
  RSS(ref_dict_free(node_dict), "free nodes");

  return REF_SUCCESS;
}